

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O3

void __thiscall ConditionalJoin::moveCbranch(ConditionalJoin *this)

{
  Varnode *pVVar1;
  mapped_type *ppVVar2;
  Varnode *vn;
  key_type local_28;
  
  vn = (this->cbranch1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  pVVar1 = (this->cbranch2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
           _M_impl.super__Vector_impl_data._M_start[1];
  Funcdata::opUninsert(this->data,this->cbranch1);
  Funcdata::opInsertEnd(this->data,this->cbranch1,this->joinblock);
  if (vn != pVVar1) {
    local_28.side1 = vn;
    local_28.side2 = pVVar1;
    ppVVar2 = std::
              map<ConditionalJoin::MergePair,_Varnode_*,_std::less<ConditionalJoin::MergePair>,_std::allocator<std::pair<const_ConditionalJoin::MergePair,_Varnode_*>_>_>
              ::operator[](&this->mergeneed,&local_28);
    vn = *ppVVar2;
  }
  Funcdata::opSetInput(this->data,this->cbranch1,vn,1);
  Funcdata::opDestroy(this->data,this->cbranch2);
  return;
}

Assistant:

void ConditionalJoin::moveCbranch(void)

{
  Varnode *vn1 = cbranch1->getIn(1);
  Varnode *vn2 = cbranch2->getIn(1);
  data.opUninsert(cbranch1);
  data.opInsertEnd(cbranch1,joinblock);
  Varnode *vn;
  if (vn1 != vn2)
    vn = mergeneed[ MergePair(vn1,vn2) ];
  else
    vn = vn1;
  data.opSetInput(cbranch1,vn,1);
  data.opDestroy(cbranch2);
}